

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

void init_args_info(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->help_help = gengetopt_args_info_help[0];
  args_info->version_help = gengetopt_args_info_help[1];
  args_info->input_help = gengetopt_args_info_help[2];
  args_info->output_help = gengetopt_args_info_help[3];
  args_info->start_help = gengetopt_args_info_help[4];
  args_info->end_help = gengetopt_args_info_help[5];
  args_info->number_help = gengetopt_args_info_help[6];
  return;
}

Assistant:

static
void init_args_info(struct gengetopt_args_info *args_info)
{


  args_info->help_help = gengetopt_args_info_help[0] ;
  args_info->version_help = gengetopt_args_info_help[1] ;
  args_info->input_help = gengetopt_args_info_help[2] ;
  args_info->output_help = gengetopt_args_info_help[3] ;
  args_info->start_help = gengetopt_args_info_help[4] ;
  args_info->end_help = gengetopt_args_info_help[5] ;
  args_info->number_help = gengetopt_args_info_help[6] ;
  
}